

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ComponentPtr __thiscall
libcellml::Parser::ParserImpl::loadComponentRef
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node,NameList *usedNames)

{
  IssueImpl *pIVar1;
  string *psVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ComponentEntity *pCVar5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_R8;
  ComponentPtr CVar6;
  IssuePtr issue_4;
  XmlNodePtr childComponentNode;
  IssuePtr issue_3;
  IssuePtr issue;
  XmlAttributePtr attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string textNode;
  string childEncapsulationId;
  ComponentPtr childComponent;
  IssuePtr issue_2;
  string parentComponentName;
  string encapsulationId;
  
  parentComponentName._M_dataplus._M_p = (pointer)&parentComponentName.field_2;
  parentComponentName._M_string_length = 0;
  parentComponentName.field_2._M_local_buf[0] = '\0';
  encapsulationId._M_dataplus._M_p = (pointer)&encapsulationId.field_2;
  encapsulationId._M_string_length = 0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encapsulationId.field_2._M_local_buf[0] = '\0';
  XmlNode::firstAttribute((XmlNode *)&attribute);
  while (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar3 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"component","");
    if (bVar3) {
      XmlAttribute::value_abi_cxx11_
                (&childEncapsulationId,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::__cxx11::string::operator=
                ((string *)&parentComponentName,(string *)&childEncapsulationId);
      std::__cxx11::string::~string((string *)&childEncapsulationId);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (*(undefined8 *)in_R8,*(undefined8 *)(in_R8 + 8),&parentComponentName);
      if (_Var4._M_current ==
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_R8 + 8)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>(in_R8,&parentComponentName);
      }
      else {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_118,
                   (NamedEntity *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"Encapsulation in model \'",&local_118);
        std::operator+(&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"\' specifies \'");
        std::operator+(&textNode,&local_138,&parentComponentName);
        std::operator+(&childEncapsulationId,&textNode,
                       "\' as a component in a component_ref but it is not unique.");
        Issue::IssueImpl::setDescription(pIVar1,&childEncapsulationId);
        std::__cxx11::string::~string((string *)&childEncapsulationId);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&issue_3);
        std::__cxx11::string::~string((string *)&local_118);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,(ModelPtr *)node);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      bVar3 = ComponentEntity::containsComponent
                        ((ComponentEntity *)
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,&parentComponentName,true);
      if (bVar3) {
        ComponentEntity::takeComponent
                  ((ComponentEntity *)&childEncapsulationId,
                   (string *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,SUB81(&parentComponentName,0));
        std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                   &childEncapsulationId);
        this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  &childEncapsulationId._M_string_length;
      }
      else {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_118,
                   (NamedEntity *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"Encapsulation in model \'",&local_118);
        std::operator+(&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"\' specifies \'");
        std::operator+(&textNode,&local_138,&parentComponentName);
        std::operator+(&childEncapsulationId,&textNode,
                       "\' as a component in a component_ref but it does not exist in the model.");
        Issue::IssueImpl::setDescription(pIVar1,&childEncapsulationId);
        std::__cxx11::string::~string((string *)&childEncapsulationId);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&issue_3);
        std::__cxx11::string::~string((string *)&local_118);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,(ModelPtr *)node);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue);
        this_00 = &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
LAB_002041b3:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    }
    else {
      bVar3 = isIdAttribute(&attribute,
                            *(bool *)&model[6].
                                      super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
      if (!bVar3) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_118,
                   (NamedEntity *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"Encapsulation in model \'",&local_118);
        std::operator+(&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"\' has an invalid component_ref attribute \'");
        XmlAttribute::name_abi_cxx11_
                  ((string *)&issue,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::operator+(&textNode,&local_138,(string *)&issue);
        std::operator+(&childEncapsulationId,&textNode,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&childEncapsulationId);
        std::__cxx11::string::~string((string *)&childEncapsulationId);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&issue);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&issue_3);
        std::__cxx11::string::~string((string *)&local_118);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,(ModelPtr *)node);
        Issue::IssueImpl::setReferenceRule
                  ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,COMPONENT_REF_ELEMENT);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue_2);
        this_00 = &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_002041b3;
      }
      XmlAttribute::value_abi_cxx11_
                (&childEncapsulationId,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::__cxx11::string::operator=((string *)&encapsulationId,(string *)&childEncapsulationId);
      std::__cxx11::string::~string((string *)&childEncapsulationId);
    }
    XmlAttribute::next((XmlAttribute *)&childEncapsulationId);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)
               &childEncapsulationId);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&childEncapsulationId._M_string_length)
    ;
  }
  pCVar5 = (ComponentEntity *)
           (this->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar5 == (ComponentEntity *)0x0) {
    if (parentComponentName._M_string_length == 0) {
      Issue::IssueImpl::create();
      pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_138,
                 (NamedEntity *)
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      std::operator+(&textNode,"Encapsulation in model \'",&local_138);
      std::operator+(&childEncapsulationId,&textNode,
                     "\' does not have a valid component attribute in a component_ref element.");
      Issue::IssueImpl::setDescription(pIVar1,&childEncapsulationId);
      std::__cxx11::string::~string((string *)&childEncapsulationId);
      std::__cxx11::string::~string((string *)&textNode);
      std::__cxx11::string::~string((string *)&local_138);
      AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                ((((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,(ModelPtr *)node);
      Issue::IssueImpl::setReferenceRule
                ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE);
      Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue_3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    ComponentEntity::setEncapsulationId(pCVar5,&encapsulationId);
  }
  XmlNode::firstChild((XmlNode *)&childComponentNode);
  childEncapsulationId._M_dataplus._M_p = (pointer)&childEncapsulationId.field_2;
  childEncapsulationId._M_string_length = 0;
  childEncapsulationId.field_2._M_local_buf[0] = '\0';
  do {
    if (childComponentNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      std::__cxx11::string::~string((string *)&childEncapsulationId);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childComponentNode.
                  super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&encapsulationId);
      std::__cxx11::string::~string((string *)&parentComponentName);
      CVar6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      CVar6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ComponentPtr)
             CVar6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
    }
    childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar3 = parseNode((ParserImpl *)model,&childComponentNode,"component_ref");
    if (bVar3) {
      loadComponentRef((ParserImpl *)&textNode,model,node,(NameList *)&childComponentNode);
      std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&childComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
      psVar2 = &textNode;
LAB_00204397:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
    }
    else {
      bVar3 = XmlNode::isText(childComponentNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (bVar3) {
        XmlNode::convertToString_abi_cxx11_
                  (&textNode,
                   childComponentNode.
                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar3 = hasNonWhitespaceCharacters(&textNode);
        if (bVar3) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    ((string *)&issue_2,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"Encapsulation in model \'",(string *)&issue_2);
          std::operator+(&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"\' has an invalid non-whitespace child text element \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3,&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &textNode);
          std::operator+(&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&issue_3);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&issue);
          std::__cxx11::string::~string((string *)&issue_2);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,(ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue_4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&textNode);
      }
      else {
        bVar3 = XmlNode::isComment(childComponentNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (!bVar3) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+(&local_118,"Encapsulation in model \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3,&local_118,"\' has an invalid child element \'");
          XmlNode::name_abi_cxx11_
                    ((string *)&issue_2,
                     childComponentNode.
                     super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          std::operator+(&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3,(string *)&issue_2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &textNode,&local_138,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&issue_2);
          std::__cxx11::string::~string((string *)&issue_3);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&issue);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,(ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,COMPONENT_REF_CHILD);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,&issue_4);
          psVar2 = (string *)&issue_4;
          goto LAB_00204397;
        }
      }
    }
    if (childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      pCVar5 = (ComponentEntity *)
               (this->super_LoggerImpl).mErrors.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pCVar5 == (ComponentEntity *)0x0) {
        pCVar5 = (ComponentEntity *)
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      ComponentEntity::addComponent(pCVar5,&childComponent);
    }
    XmlNode::next((XmlNode *)&textNode);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&childComponentNode.
                super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

ComponentPtr Parser::ParserImpl::loadComponentRef(const ModelPtr &model, const XmlNodePtr &node, NameList &usedNames)
{
    ComponentPtr parentComponent = nullptr;
    std::string parentComponentName;
    std::string encapsulationId;
    // Check for a component in the parent component_ref.
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("component")) {
            parentComponentName = attribute->value();

            if (std::find(usedNames.begin(), usedNames.end(), parentComponentName) == usedNames.end()) {
                usedNames.emplace_back(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it is not unique.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
                addIssue(issue);
            }

            if (model->containsComponent(parentComponentName)) {
                // Will re-add this to the model once we encapsulate the child(ren).
                parentComponent = model->takeComponent(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it does not exist in the model.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            encapsulationId = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid component_ref attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }
    if (!parentComponent && parentComponentName.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not have a valid component attribute in a component_ref element.");
        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE);
        addIssue(issue);
    } else if (parentComponent) {
        parentComponent->setEncapsulationId(encapsulationId);
    }

    // Get first child of this parent component_ref.
    XmlNodePtr childComponentNode = node->firstChild();

    // Loop over encapsulated children.
    std::string childEncapsulationId;
    while (childComponentNode) {
        ComponentPtr childComponent = nullptr;
        if (parseNode(childComponentNode, "component_ref")) {
            childComponent = loadComponentRef(model, childComponentNode, usedNames);
        } else if (childComponentNode->isText()) {
            const std::string textNode = childComponentNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childComponentNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + childComponentNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_CHILD);
            addIssue(issue);
        }

        if (childComponent) {
            // Set parent/child encapsulation relationship.
            if (parentComponent) {
                parentComponent->addComponent(childComponent);
            } else {
                // Making sure that children which were taken from parents above, but have
                // invalid parents, are still included in the model.
                model->addComponent(childComponent);
            }
        }
        childComponentNode = childComponentNode->next();
    }

    return parentComponent;
}